

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase706::run(TestCase706 *this)

{
  PathPtr fromPath;
  PathPtr toPath;
  Directory *pDVar1;
  Directory *this_00;
  bool bVar2;
  int iVar3;
  ArrayPtr<const_kj::StringPtr> parts;
  PathPtr path;
  StringPtr text;
  ArrayPtr<const_kj::StringPtr> parts_00;
  PathPtr path_00;
  StringPtr text_00;
  StringPtr name;
  StringPtr name_00;
  ArrayPtr<const_kj::StringPtr> parts_01;
  PathPtr path_01;
  ArrayPtr<const_kj::StringPtr> parts_02;
  PathPtr path_02;
  ArrayPtr<const_kj::StringPtr> parts_03;
  PathPtr path_03;
  ArrayPtr<const_kj::StringPtr> parts_04;
  PathPtr path_04;
  ArrayPtr<const_kj::StringPtr> parts_05;
  ArrayPtr<const_kj::StringPtr> parts_06;
  ArrayPtr<const_kj::StringPtr> parts_07;
  PathPtr path_05;
  Array<kj::String> local_f0;
  Array<kj::String> local_d8;
  Own<const_kj::ReadableFile> local_c0;
  Own<kj::Directory> src;
  Own<kj::Directory> dst;
  StringPtr local_90;
  TestClock clock;
  Array<kj::String> local_70;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  String *local_40;
  size_t sStack_38;
  
  clock.super_Clock._vptr_Clock = (_func_int **)&PTR_now_00422458;
  clock.time.value.value = (Quantity<long,_kj::_::NanosecondLabel>)1000000000;
  newInMemoryDirectory((kj *)&src,&clock.super_Clock);
  newInMemoryDirectory((kj *)&dst,&clock.super_Clock);
  pDVar1 = src.ptr;
  local_70.ptr = (String *)0x357ec7;
  local_70.size_ = 4;
  local_70.disposer = (ArrayDisposer *)0x33b5a1;
  local_58 = 4;
  parts.size_ = 2;
  parts.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_f0,parts);
  path.parts.size_ = (size_t)local_f0.ptr;
  path.parts.ptr = (String *)pDVar1;
  Directory::openFile((Directory *)&local_d8,path,(WriteMode)local_f0.size_);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_d8.size_,text);
  Own<const_kj::File>::dispose((Own<const_kj::File> *)&local_d8);
  Array<kj::String>::~Array(&local_f0);
  pDVar1 = src.ptr;
  local_70.ptr = (String *)0x357ec7;
  local_70.size_ = 4;
  local_70.disposer = (ArrayDisposer *)0x3301d1;
  local_58 = 4;
  local_50 = "qux";
  local_48 = 4;
  parts_00.size_ = 3;
  parts_00.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_f0,parts_00);
  path_00.parts.size_ = (size_t)local_f0.ptr;
  path_00.parts.ptr = (String *)pDVar1;
  Directory::openFile((Directory *)&local_d8,path_00,(WriteMode)local_f0.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_d8.size_,text_00);
  Own<const_kj::File>::dispose((Own<const_kj::File> *)&local_d8);
  Array<kj::String>::~Array(&local_f0);
  TestClock::expectChanged(&clock,(FsNode *)src.ptr);
  TestClock::expectUnchanged(&clock,(FsNode *)dst.ptr);
  this_00 = dst.ptr;
  name.content.size_ = 5;
  name.content.ptr = "link";
  Path::Path((Path *)&local_70,name);
  pDVar1 = src.ptr;
  toPath.parts.size_ = local_70.size_;
  toPath.parts.ptr = local_70.ptr;
  name_00.content.size_ = 4;
  name_00.content.ptr = "foo";
  Path::Path((Path *)&local_f0,name_00);
  local_40 = local_f0.ptr;
  sStack_38 = local_f0.size_;
  fromPath.parts.size_ = local_f0.size_;
  fromPath.parts.ptr = local_f0.ptr;
  Directory::transfer(this_00,toPath,CREATE,pDVar1,fromPath,COPY);
  Array<kj::String>::~Array(&local_f0);
  Array<kj::String>::~Array(&local_70);
  TestClock::expectUnchanged(&clock,(FsNode *)src.ptr);
  TestClock::expectChanged(&clock,(FsNode *)dst.ptr);
  pDVar1 = src.ptr;
  local_70.ptr = (String *)0x357ec7;
  local_70.size_ = 4;
  local_70.disposer = (ArrayDisposer *)0x33b5a1;
  local_58 = 4;
  parts_01.size_ = 2;
  parts_01.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_d8,parts_01);
  path_01.parts.size_ = (size_t)local_d8.ptr;
  path_01.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_c0,path_01);
  ReadableFile::readAllText((String *)&local_f0,local_c0.ptr);
  local_90.content.ptr = "foobar";
  local_90.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_f0,&local_90);
  Array<char>::~Array((Array<char> *)&local_f0);
  Own<const_kj::ReadableFile>::dispose(&local_c0);
  Array<kj::String>::~Array(&local_d8);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[80]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d3,ERROR,
               "\"failed: expected \" \"src->openFile(Path({\\\"foo\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [80])
                "failed: expected src->openFile(Path({\"foo\", \"bar\"}))->readAllText() == \"foobar\""
              );
  }
  pDVar1 = src.ptr;
  local_70.ptr = (String *)0x357ec7;
  local_70.size_ = 4;
  local_70.disposer = (ArrayDisposer *)0x3301d1;
  local_58 = 4;
  local_50 = "qux";
  local_48 = 4;
  parts_02.size_ = 3;
  parts_02.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_d8,parts_02);
  path_02.parts.size_ = (size_t)local_d8.ptr;
  path_02.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_c0,path_02);
  ReadableFile::readAllText((String *)&local_f0,local_c0.ptr);
  local_90.content.ptr = "bazqux";
  local_90.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_f0,&local_90);
  Array<char>::~Array((Array<char> *)&local_f0);
  Own<const_kj::ReadableFile>::dispose(&local_c0);
  Array<kj::String>::~Array(&local_d8);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[87]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d4,ERROR,
               "\"failed: expected \" \"src->openFile(Path({\\\"foo\\\", \\\"baz\\\", \\\"qux\\\"}))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [87])
                "failed: expected src->openFile(Path({\"foo\", \"baz\", \"qux\"}))->readAllText() == \"bazqux\""
              );
  }
  pDVar1 = dst.ptr;
  local_70.ptr = (String *)0x349bf0;
  local_70.size_ = 5;
  local_70.disposer = (ArrayDisposer *)0x33b5a1;
  local_58 = 4;
  parts_03.size_ = 2;
  parts_03.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_d8,parts_03);
  path_03.parts.size_ = (size_t)local_d8.ptr;
  path_03.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_c0,path_03);
  ReadableFile::readAllText((String *)&local_f0,local_c0.ptr);
  local_90.content.ptr = "foobar";
  local_90.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_f0,&local_90);
  Array<char>::~Array((Array<char> *)&local_f0);
  Own<const_kj::ReadableFile>::dispose(&local_c0);
  Array<kj::String>::~Array(&local_d8);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[81]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d5,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [81])
                "failed: expected dst->openFile(Path({\"link\", \"bar\"}))->readAllText() == \"foobar\""
              );
  }
  pDVar1 = dst.ptr;
  local_70.ptr = (String *)0x349bf0;
  local_70.size_ = 5;
  local_70.disposer = (ArrayDisposer *)0x3301d1;
  local_58 = 4;
  local_50 = "qux";
  local_48 = 4;
  parts_04.size_ = 3;
  parts_04.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_d8,parts_04);
  path_04.parts.size_ = (size_t)local_d8.ptr;
  path_04.parts.ptr = (String *)pDVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_c0,path_04);
  ReadableFile::readAllText((String *)&local_f0,local_c0.ptr);
  local_90.content.ptr = "bazqux";
  local_90.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_f0,&local_90);
  Array<char>::~Array((Array<char> *)&local_f0);
  Own<const_kj::ReadableFile>::dispose(&local_c0);
  Array<kj::String>::~Array(&local_d8);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[88]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d6,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"baz\\\", \\\"qux\\\"}))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [88])
                "failed: expected dst->openFile(Path({\"link\", \"baz\", \"qux\"}))->readAllText() == \"bazqux\""
              );
  }
  pDVar1 = dst.ptr;
  local_70.ptr = (String *)0x349bf0;
  local_70.size_ = 5;
  local_70.disposer = (ArrayDisposer *)0x33b5a1;
  local_58 = 4;
  parts_05.size_ = 2;
  parts_05.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_f0,parts_05);
  iVar3 = (*(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[8])
                    (pDVar1,local_f0.ptr,local_f0.size_);
  Array<kj::String>::~Array(&local_f0);
  if ((char)iVar3 == '\0' && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[52]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2d8,ERROR,
               "\"failed: expected \" \"dst->exists(Path({\\\"link\\\", \\\"bar\\\"}))\"",
               (char (*) [52])"failed: expected dst->exists(Path({\"link\", \"bar\"}))");
  }
  local_70.ptr = (String *)0x357ec7;
  local_70.size_ = 4;
  local_70.disposer = (ArrayDisposer *)0x33b5a1;
  local_58 = 4;
  parts_06.size_ = 2;
  parts_06.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_f0,parts_06);
  Directory::remove(src.ptr,(char *)local_f0.ptr);
  Array<kj::String>::~Array(&local_f0);
  local_70.ptr = (String *)0x349bf0;
  local_70.size_ = 5;
  local_70.disposer = (ArrayDisposer *)0x33b5a1;
  local_58 = 4;
  parts_07.size_ = 2;
  parts_07.ptr = (StringPtr *)&local_70;
  Path::Path((Path *)&local_d8,parts_07);
  path_05.parts.size_ = (size_t)local_d8.ptr;
  path_05.parts.ptr = (String *)dst.ptr;
  ReadableDirectory::openFile((ReadableDirectory *)&local_c0,path_05);
  ReadableFile::readAllText((String *)&local_f0,local_c0.ptr);
  local_90.content.ptr = "foobar";
  local_90.content.size_ = 7;
  bVar2 = String::operator==((String *)&local_f0,&local_90);
  Array<char>::~Array((Array<char> *)&local_f0);
  Own<const_kj::ReadableFile>::dispose(&local_c0);
  Array<kj::String>::~Array(&local_d8);
  if (!bVar2 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[81]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++"
               ,0x2da,ERROR,
               "\"failed: expected \" \"dst->openFile(Path({\\\"link\\\", \\\"bar\\\"}))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [81])
                "failed: expected dst->openFile(Path({\"link\", \"bar\"}))->readAllText() == \"foobar\""
              );
  }
  Own<kj::Directory>::dispose(&dst);
  Own<kj::Directory>::dispose(&src);
  return;
}

Assistant:

void tick() {
    time += 1 * SECONDS;
  }